

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,size_t stackCapacity
                 ,CrtAllocator *stackAllocator)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar1;
  
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = (Ch *)0x0;
  *(undefined8 *)
   ((long)&(this->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_ + 8) = 0;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).flags_ = 0;
  this->allocator_ = allocator;
  this->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  (this->stack_).allocator_ = stackAllocator;
  (this->stack_).ownAllocator_ = (CrtAllocator *)0x0;
  (this->stack_).stack_ = (char *)0x0;
  (this->stack_).stackTop_ = (char *)0x0;
  (this->stack_).stackEnd_ = (char *)0x0;
  (this->stack_).initialCapacity_ = stackCapacity;
  if (stackCapacity != 0) {
    (this->parseResult_).code_ = kParseErrorNone;
    (this->parseResult_).offset_ = 0;
    if (allocator == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
      pMVar1 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
      pMVar1->chunkHead_ = (ChunkHeader *)0x0;
      pMVar1->chunk_capacity_ = 0x10000;
      pMVar1->userBuffer_ = (void *)0x0;
      pMVar1->baseAllocator_ = (CrtAllocator *)0x0;
      pMVar1->ownBaseAllocator_ = (CrtAllocator *)0x0;
      this->allocator_ = pMVar1;
      this->ownAllocator_ = pMVar1;
    }
    return;
  }
  __assert_fail("stackCapacity > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/internal/stack.h"
                ,0x23,
                "rapidjson::internal::Stack<rapidjson::CrtAllocator>::Stack(Allocator *, size_t) [Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

GenericValue() RAPIDJSON_NOEXCEPT : data_(), flags_(kNullFlag) {}